

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

string * __thiscall
trieste::utf8::escape_unicode_abi_cxx11_
          (string *__return_storage_ptr__,utf8 *this,string_view *input)

{
  ulong uVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  size_type sVar4;
  type *ptVar5;
  type *this_00;
  ostream *poVar6;
  undefined8 uVar7;
  void *pvVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  type *s;
  type *r;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  pair<trieste::utf8::rune,_std::basic_string_view<char,_std::char_traits<char>_>_> local_1b0;
  ulong local_198;
  size_t pos;
  ostringstream os;
  string_view *input_local;
  
  os._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pos);
  local_198 = 0;
  while( true ) {
    uVar1 = local_198;
    sVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)os._368_8_);
    if (sVar4 <= uVar1) break;
    bVar9 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)os._368_8_,local_198,
                       0xffffffffffffffff);
    local_1c0 = bVar9;
    utf8_to_rune(&local_1b0,(string_view *)&local_1c0,false);
    ptVar5 = std::get<0ul,trieste::utf8::rune,std::basic_string_view<char,std::char_traits<char>>>
                       (&local_1b0);
    this_00 = std::get<1ul,trieste::utf8::rune,std::basic_string_view<char,std::char_traits<char>>>
                        (&local_1b0);
    if (ptVar5->value < 0x8000) {
      if (ptVar5->value < 0x80) {
        std::operator<<((ostream *)&pos,(char)ptVar5->value);
      }
      else {
        poVar6 = std::operator<<((ostream *)&pos,"\\u");
        uVar7 = std::ostream::operator<<(poVar6,std::uppercase);
        _Var2 = std::setfill<char>('0');
        poVar6 = std::operator<<(uVar7,_Var2._M_c);
        _Var3 = CLI::std::setw(4);
        poVar6 = std::operator<<(poVar6,_Var3);
        pvVar8 = (void *)std::ostream::operator<<(poVar6,std::hex);
        std::ostream::operator<<(pvVar8,ptVar5->value);
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&pos,"\\U");
      uVar7 = std::ostream::operator<<(poVar6,std::uppercase);
      _Var2 = std::setfill<char>('0');
      poVar6 = std::operator<<(uVar7,_Var2._M_c);
      _Var3 = CLI::std::setw(8);
      poVar6 = std::operator<<(poVar6,_Var3);
      pvVar8 = (void *)std::ostream::operator<<(poVar6,std::hex);
      std::ostream::operator<<(pvVar8,ptVar5->value);
    }
    sVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
    local_198 = sVar4 + local_198;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pos);
  return __return_storage_ptr__;
}

Assistant:

inline std::string escape_unicode(const std::string_view& input)
    {
      std::ostringstream os;
      std::size_t pos = 0;
      while (pos < input.size())
      {
        auto [r, s] = utf8_to_rune(input.substr(pos), false);
        if (r.value > 0x7FFF)
        {
          os << "\\U" << std::uppercase << std::setfill('0') << std::setw(8)
             << std::hex << r.value;
        }
        else if (r.value > 0x7F)
        {
          os << "\\u" << std::uppercase << std::setfill('0') << std::setw(4)
             << std::hex << r.value;
        }
        else
        {
          os << (char)r.value;
        }
        pos += s.size();
      }

      return os.str();
    }